

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

amqp_rpc_reply_t *
amqp_login_with_properties
          (amqp_connection_state_t state,char *vhost,int channel_max,int frame_max,int heartbeat,
          amqp_table_t *client_properties,amqp_sasl_method_enum sasl_method,...)

{
  char in_AL;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  amqp_rpc_reply_t *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined4 in_stack_00000010;
  amqp_rpc_reply_t *ret;
  va_list vl;
  int in_stack_0000033c;
  int in_stack_00000340;
  int in_stack_00000344;
  char *in_stack_00000348;
  amqp_connection_state_t in_stack_00000350;
  amqp_table_t *in_stack_00000360;
  timeval *in_stack_00000368;
  amqp_sasl_method_enum in_stack_00000370;
  __va_list_tag *in_stack_00000378;
  undefined1 local_118 [48];
  undefined4 local_e8;
  undefined4 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  void *local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Da;
    local_d8 = in_XMM1_Da;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_38 = local_118;
  local_40 = &stack0x00000018;
  local_44 = 0x30;
  local_48 = 0x30;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  amqp_login_inner(in_stack_00000350,in_stack_00000348,in_stack_00000344,in_stack_00000340,
                   in_stack_0000033c,in_stack_00000360,in_stack_00000368,in_stack_00000370,
                   in_stack_00000378);
  (in_RDI->reply).decoded = local_58;
  *(undefined8 *)&in_RDI->library_error = uStack_50;
  *(undefined8 *)in_RDI = local_68;
  *(undefined8 *)&in_RDI->reply = uStack_60;
  return in_RDI;
}

Assistant:

amqp_rpc_reply_t amqp_login_with_properties(
    amqp_connection_state_t state, char const *vhost, int channel_max,
    int frame_max, int heartbeat, const amqp_table_t *client_properties,
    amqp_sasl_method_enum sasl_method, ...) {
  va_list vl;
  amqp_rpc_reply_t ret;

  va_start(vl, sasl_method);

  ret = amqp_login_inner(state, vhost, channel_max, frame_max, heartbeat,
                         client_properties, state->handshake_timeout,
                         sasl_method, vl);

  va_end(vl);

  return ret;
}